

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::OnStyleSheetChangeRecursive(Element *this)

{
  Element *this_00;
  int index;
  ulong uVar1;
  ulong uVar2;
  
  ElementEffects::DirtyEffects(&this->meta->effects);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xf])(this);
  uVar1 = (ulong)((long)(this->children).
                        super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->children).
                       super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar2 = uVar1 & 0xffffffff;
  index = 0;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
    index = 0;
  }
  for (; (int)uVar2 != index; index = index + 1) {
    this_00 = GetChild(this,index);
    OnStyleSheetChangeRecursive(this_00);
  }
  return;
}

Assistant:

void Element::OnStyleSheetChangeRecursive()
{
	meta->effects.DirtyEffects();

	OnStyleSheetChange();

	// Now dirty all of our descendants.
	const int num_children = GetNumChildren(true);
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->OnStyleSheetChangeRecursive();
}